

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

disp_binder_unique_ptr_t __thiscall
so_5::disp::one_thread::internals::create_binder_for_specific_dispatcher
          (internals *this,dispatcher_t *dispatcher)

{
  reference_wrapper<so_5::disp::one_thread::impl::actual_disp_iface_t> local_30;
  unique_ptr<so_5::disp::one_thread::impl::disp_binder_for_specific_dispatcher_t,_std::default_delete<so_5::disp::one_thread::impl::disp_binder_for_specific_dispatcher_t>_>
  local_28;
  actual_disp_iface_t *local_20;
  actual_disp_iface_t *actual_dispatcher;
  dispatcher_t *dispatcher_local;
  
  actual_dispatcher = (actual_disp_iface_t *)dispatcher;
  dispatcher_local = (dispatcher_t *)this;
  local_20 = (actual_disp_iface_t *)
             __dynamic_cast(dispatcher,&dispatcher_t::typeinfo,
                            &one_thread::impl::actual_disp_iface_t::typeinfo,0);
  if (local_20 == (actual_disp_iface_t *)0x0) {
    __cxa_bad_cast();
  }
  local_30 = std::ref<so_5::disp::one_thread::impl::actual_disp_iface_t>(local_20);
  stdcpp::
  make_unique<so_5::disp::one_thread::impl::disp_binder_for_specific_dispatcher_t,std::reference_wrapper<so_5::disp::one_thread::impl::actual_disp_iface_t>>
            ((stdcpp *)&local_28,&local_30);
  std::unique_ptr<so_5::disp_binder_t,std::default_delete<so_5::disp_binder_t>>::
  unique_ptr<so_5::disp::one_thread::impl::disp_binder_for_specific_dispatcher_t,std::default_delete<so_5::disp::one_thread::impl::disp_binder_for_specific_dispatcher_t>,void>
            ((unique_ptr<so_5::disp_binder_t,std::default_delete<so_5::disp_binder_t>> *)this,
             &local_28);
  std::
  unique_ptr<so_5::disp::one_thread::impl::disp_binder_for_specific_dispatcher_t,_std::default_delete<so_5::disp::one_thread::impl::disp_binder_for_specific_dispatcher_t>_>
  ::~unique_ptr(&local_28);
  return (__uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true>
         )(__uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true>
           )this;
}

Assistant:

disp_binder_unique_ptr_t
create_binder_for_specific_dispatcher(
	so_5::dispatcher_t & dispatcher )
{
	using namespace so_5::disp::one_thread::impl;

	actual_disp_iface_t & actual_dispatcher =
		dynamic_cast< actual_disp_iface_t & >(dispatcher);

	return stdcpp::make_unique< disp_binder_for_specific_dispatcher_t >(
			std::ref(actual_dispatcher) );
}